

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_keys.cpp
# Opt level: O1

void ClearLocks(void)

{
  PClassActor *pPVar1;
  BYTE *pBVar2;
  Lock *this;
  PClass *pPVar3;
  PClassActor **ppPVar4;
  ulong uVar5;
  ulong uVar6;
  PClassActor *pPVar7;
  long lVar8;
  
  ppPVar4 = PClassActor::AllActorClasses.Array;
  pPVar3 = AKey::RegistrationInfo.MyClass;
  uVar5 = (ulong)PClassActor::AllActorClasses.Count;
  if (uVar5 != 0) {
    uVar6 = 0;
    do {
      pPVar1 = ppPVar4[uVar6];
      pPVar7 = pPVar1;
      if (pPVar1 == (PClassActor *)pPVar3) {
LAB_005e4897:
        pBVar2 = (pPVar1->super_PClass).Defaults;
        if (pBVar2 != (BYTE *)0x0) {
          pBVar2[0x4dc] = '\0';
        }
      }
      else {
        do {
          pPVar7 = (PClassActor *)(pPVar7->super_PClass).ParentClass;
          if (pPVar7 == (PClassActor *)pPVar3) break;
        } while (pPVar7 != (PClassActor *)0x0);
        if (pPVar7 != (PClassActor *)0x0) goto LAB_005e4897;
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != uVar5);
  }
  lVar8 = 0;
  do {
    this = *(Lock **)((long)locks + lVar8);
    if (this != (Lock *)0x0) {
      Lock::~Lock(this);
      operator_delete(this,0x38);
      *(undefined8 *)((long)locks + lVar8) = 0;
    }
    lVar8 = lVar8 + 8;
  } while (lVar8 != 0x800);
  currentnumber = 0;
  keysdone = 0;
  return;
}

Assistant:

static void ClearLocks()
{
	unsigned int i;
	for(i = 0; i < PClassActor::AllActorClasses.Size(); i++)
	{
		if (PClassActor::AllActorClasses[i]->IsDescendantOf(RUNTIME_CLASS(AKey)))
		{
			AKey *key = static_cast<AKey*>(GetDefaultByType(PClassActor::AllActorClasses[i]));
			if (key != NULL)
			{
				key->KeyNumber = 0;
			}
		}
	}
	for(i = 0; i < 256; i++)
	{
		if (locks[i] != NULL) 
		{
			delete locks[i];
			locks[i] = NULL;
		}
	}
	currentnumber = 0;
	keysdone = false;
}